

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_ppc(uc_struct_conflict10 *uc,CPUState_conflict *cpu)

{
  TranslationBlock_conflict **ppTVar1;
  uint32_t flags;
  uc_struct_conflict10 *puVar2;
  void *pvVar3;
  CPUClass *pCVar4;
  void *pvVar5;
  long lVar6;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var7;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var8;
  CPUWatchpoint *pCVar9;
  _Bool _Var10;
  char cVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  TranslationBlock_conflict *pTVar15;
  ulong uVar16;
  long lVar17;
  TranslationBlock_conflict *pTVar18;
  TranslationBlock_conflict *pTVar19;
  uint cf_mask;
  CPUClass *pCVar20;
  TranslationBlock_conflict *pTVar21;
  uint32_t cflags;
  list_item *plVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar20 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar20->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar20->has_work)(cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar20->cpu_exec_enter)(cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar12 != 0) {
    pCVar20 = cpu->cc;
  }
LAB_00a7af3c:
  puVar2 = cpu->uc;
  uVar14 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict10)0x0) {
    _Var10 = (*puVar2->stop_interrupt)(puVar2,uVar14);
    if (_Var10) {
      plVar22 = puVar2->hook[0xe].head;
      goto joined_r0x00a7b5eb;
    }
    uVar14 = cpu->exception_index;
  }
  if (-1 < (int)uVar14) {
    if (0xffff < uVar14) {
      if (uVar14 == 0x10002) {
        pCVar4 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar9 = (cpu->watchpoints).tqh_first; pCVar9 != (CPUWatchpoint *)0x0;
              pCVar9 = (pCVar9->entry).tqe_next) {
            *(byte *)&pCVar9->flags = (byte)pCVar9->flags & 0x3f;
          }
        }
        (*pCVar4->debug_excp_handler)(cpu);
      }
      cpu->exception_index = -1;
      goto LAB_00a7b676;
    }
    ppTVar1 = puVar2->cpu[1].tb_jmp_cache + 0x37b;
    *(int *)ppTVar1 = *(int *)ppTVar1 + 4;
    plVar22 = puVar2->hook[0].head;
    if (plVar22 == (list_item *)0x0) goto LAB_00a7b5ca;
    bVar23 = false;
    do {
      pvVar3 = plVar22->data;
      if (pvVar3 == (void *)0x0) break;
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar23 = true;
      }
      plVar22 = plVar22->next;
    } while (plVar22 != (list_item *)0x0);
    if (!bVar23) goto LAB_00a7b5ca;
    cpu->exception_index = -1;
  }
  pTVar19 = (TranslationBlock_conflict *)0x0;
  pTVar18 = pTVar19;
  while( true ) {
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1a6a) = 0;
    uVar14 = cpu->interrupt_request;
    if (uVar14 != 0) {
      uVar13 = uVar14;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar13 = uVar14 & 0xffffeda5;
      }
      if ((char)uVar13 < '\0') {
        cpu->interrupt_request = uVar14 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_00a7af3c;
      }
      if ((uVar13 >> 10 & 1) != 0) {
        cpu_reset((CPUState *)cpu);
        goto LAB_00a7af3c;
      }
      _Var10 = (*pCVar4->cpu_exec_interrupt)(cpu,uVar13);
      if (_Var10) {
        cpu->exception_index = -1;
        pTVar18 = (TranslationBlock_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar18 = (TranslationBlock_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar2 = cpu->uc;
    uVar14 = *(uint *)((long)cpu->env_ptr + 0x160);
    flags = *(uint32_t *)((long)cpu->env_ptr + 0x118fc);
    uVar13 = uVar14 >> 6 ^ uVar14;
    uVar13 = uVar13 & 0x3f | uVar13 >> 6 & 0xfc0;
    pTVar15 = cpu->tb_jmp_cache[uVar13];
    cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar15 == (TranslationBlock_conflict *)0x0) || (pTVar15->pc != uVar14)) ||
         (pTVar15->cs_base != 0)) ||
        ((pTVar15->flags != flags || (cpu->trace_dstate[0] != (ulong)pTVar15->trace_vcpu_dstate))))
       || ((pTVar15->cflags & 0xff0effff) != cf_mask)) {
      pTVar15 = tb_htable_lookup_ppc(cpu,uVar14,0,flags,cf_mask);
      if (pTVar15 == (TranslationBlock_conflict *)0x0) {
        pTVar15 = tb_gen_code_ppc(cpu,uVar14,0,flags,cflags);
        cpu->tb_jmp_cache[uVar13] = pTVar15;
        pTVar21 = puVar2->last_tb;
        if (pTVar21 != (TranslationBlock_conflict *)0x0) {
          local_40 = (ulong)pTVar15->pc;
          uVar14._0_2_ = pTVar15->size;
          uVar14._2_2_ = pTVar15->icount;
          auVar24 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0xe1);
          local_38 = auVar24._0_4_;
          local_50 = (ulong)pTVar21->pc;
          uVar13._0_2_ = pTVar21->size;
          uVar13._2_2_ = pTVar21->icount;
          auVar24 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0xe1);
          local_48 = auVar24._0_4_;
          for (plVar22 = puVar2->hook[0xf].head;
              (plVar22 != (list_item *)0x0 && (pvVar3 = plVar22->data, pvVar3 != (void *)0x0));
              plVar22 = plVar22->next) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
                (ulong)pTVar15->pc <= *(ulong *)((long)pvVar3 + 0x20) &&
                *(ulong *)((long)pvVar3 + 0x18) <= (ulong)pTVar15->pc)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar13] = pTVar15;
      }
    }
    if ((pTVar18 != (TranslationBlock_conflict *)0x0) &&
       (pTVar15->page_addr[1] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar19) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar15->cflags & 0x40000) == 0) {
        LOCK();
        bVar23 = pTVar18->jmp_dest[(long)pTVar19] == 0;
        if (bVar23) {
          pTVar18->jmp_dest[(long)pTVar19] = (uintptr_t)pTVar15;
        }
        UNLOCK();
        if (bVar23) {
          pvVar3 = (pTVar18->tc).ptr;
          *(int *)(pTVar18->jmp_target_arg[(long)pTVar19] + (long)pvVar3) =
               (*(int *)&(pTVar15->tc).ptr -
               ((int)pTVar18->jmp_target_arg[(long)pTVar19] + (int)pvVar3)) + -4;
          pTVar18->jmp_list_next[(long)pTVar19] = pTVar15->jmp_list_head;
          pTVar15->jmp_list_head = (ulong)pTVar18 | (ulong)pTVar19;
        }
      }
    }
    if (cpu->exit_request == false) {
      pvVar3 = (pTVar15->tc).ptr;
      pvVar5 = cpu->env_ptr;
      tb_exec_lock_ppc(cpu->uc->tcg_ctx);
      uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar5 + 0x11e00) + 0x2e8) + 0x90))
                         (pvVar5,pvVar3);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_ppc(cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar21 = (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc);
      if ((uVar16 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar5 + 0x11e00) + 0x358) == 0) {
          uVar14 = *(uint *)(*(long *)((long)pvVar5 + 0x11e00) + 0x578);
          if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var7 = cpu->cc->synchronize_from_tb;
            if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var8 = cpu->cc->set_pc;
              if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00a7b6c8;
              (*p_Var8)(cpu,(ulong)pTVar21->pc);
            }
            else {
              (*p_Var7)(cpu,pTVar21);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar15;
      uVar14 = (uint)uVar16 & 3;
      pTVar19 = (TranslationBlock_conflict *)(ulong)uVar14;
      pTVar18 = pTVar21;
      if ((uVar14 == 3) &&
         (pTVar19 = (TranslationBlock_conflict *)0x3, pTVar18 = (TranslationBlock_conflict *)0x0,
         -1 < *(int *)(cpu[1].tb_jmp_cache + 0x34d))) {
        lVar6 = cpu->icount_budget;
        lVar17 = 0xffff;
        if (lVar6 < 0xffff) {
          lVar17 = lVar6;
        }
        uVar14 = (uint)lVar17;
        *(short *)(cpu[1].tb_jmp_cache + 0x34d) = (short)lVar17;
        cpu->icount_extra = lVar6 - (int)uVar14;
        pTVar18 = (TranslationBlock_conflict *)0x0;
        pTVar19 = (TranslationBlock_conflict *)0x3;
        if (0 < (int)uVar14 && lVar6 - (int)uVar14 == 0) {
          uVar13 = 0x7fff;
          if (uVar14 < 0x7fff) {
            uVar13 = uVar14;
          }
          pTVar18 = tb_gen_code_ppc(cpu,pTVar21->pc,pTVar21->cs_base,pTVar21->flags,uVar13 | 0x10000
                                   );
          pTVar18->orig_tb = pTVar21;
          pvVar3 = (pTVar18->tc).ptr;
          pvVar5 = cpu->env_ptr;
          tb_exec_lock_ppc(cpu->uc->tcg_ctx);
          uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar5 + 0x11e00) + 0x2e8) + 0x90))
                             (pvVar5,pvVar3);
          if (cpu->uc->nested_level == 1) {
            tb_exec_unlock_ppc(cpu->uc->tcg_ctx);
          }
          cpu->can_do_io = 1;
          if ((uVar16 & 2) != 0) {
            if (*(long *)(*(long *)((long)pvVar5 + 0x11e00) + 0x358) == 0) {
              uVar14 = *(uint *)(*(long *)((long)pvVar5 + 0x11e00) + 0x578);
              if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
                 (cpu->uc->quit_request == false)) {
                p_Var7 = cpu->cc->synchronize_from_tb;
                if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                  p_Var8 = cpu->cc->set_pc;
                  if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00a7b6c8:
                    __assert_fail("cc->set_pc",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                  ,0x61,
                                  "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                  }
                  (*p_Var8)(cpu,(ulong)((TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc))
                                       ->pc);
                }
                else {
                  (*p_Var7)(cpu,(TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc));
                }
              }
            }
            cpu->tcg_exit_req = 0;
          }
          tb_phys_invalidate_ppc(cpu->uc->tcg_ctx,pTVar18,0xffffffffffffffff);
          tcg_tb_remove_ppc(cpu->uc->tcg_ctx,pTVar18);
          pTVar18 = (TranslationBlock_conflict *)0x0;
          pTVar19 = (TranslationBlock_conflict *)0x3;
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_00a7af3c;
joined_r0x00a7b5eb:
  if ((plVar22 == (list_item *)0x0) || (pvVar3 = plVar22->data, pvVar3 == (void *)0x0))
  goto LAB_00a7b615;
  if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
     (cVar11 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
     cVar11 != '\0')) goto LAB_00a7b620;
  plVar22 = plVar22->next;
  goto joined_r0x00a7b5eb;
LAB_00a7b615:
  puVar2->invalid_error = 10;
  goto LAB_00a7b620;
LAB_00a7b5ca:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
LAB_00a7b620:
  uVar14 = 0x10001;
LAB_00a7b676:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar20->cpu_exec_exit)(cpu);
  return uVar14;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}